

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.hpp
# Opt level: O3

path * __thiscall
vfs::path::combine<std::__cxx11::string>
          (path *__return_storage_ptr__,path *this,path *p0,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *paths)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  path local_60;
  path local_40;
  
  path(&local_40,&p0->pathStr_);
  paVar1 = &local_60.pathStr_.field_2;
  local_60.pathStr_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,local_40.pathStr_._M_dataplus._M_p,
             local_40.pathStr_._M_dataplus._M_p + local_40.pathStr_._M_string_length);
  combine_internal(__return_storage_ptr__,this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.pathStr_._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.pathStr_._M_dataplus._M_p,
                    local_60.pathStr_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.pathStr_._M_dataplus._M_p != &local_40.pathStr_.field_2) {
    operator_delete(local_40.pathStr_._M_dataplus._M_p,
                    local_40.pathStr_.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static path combine(const path &p0, _Paths &&...paths)
        {
            return combine_internal(p0, combine(std::forward<_Paths>(paths)...));
        }